

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O0

Float<unsigned_int,_5,_5,_15,_2U>
tcu::Float<unsigned_int,5,5,15,2u>::convert<unsigned_long,11,52,1023,3u>
          (Float<unsigned_long,_11,_52,_1023,_3U> *other)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  StorageType extraout_EAX;
  ulong uVar4;
  size_t *in_RCX;
  uchar *in_RDX;
  uchar *sig;
  uchar *sig_00;
  uchar *sig_01;
  EVP_PKEY_CTX *in_RSI;
  Float<unsigned_long,_11,_52,_1023,_3U> *__tagb;
  uchar *in_R8;
  size_t in_R9;
  deUint64 bias_1;
  deUint64 half_1;
  int bitDiff_1;
  deUint64 bias;
  deUint64 half;
  uint uStack_30;
  int bitDiff;
  deUint64 m;
  int e;
  StorageType s;
  int eMax;
  int eMin;
  Float<unsigned_long,_11,_52,_1023,_3U> *other_local;
  
  iVar3 = Float<unsigned_long,_11,_52,_1023,_3U>::sign(other,in_RSI,in_RDX,in_RCX,in_R8,in_R9);
  if (iVar3 < 0) {
    other_local._4_4_ = Float<unsigned_int,_5,_5,_15,_2U>::zero(1);
  }
  else {
    bVar2 = Float<unsigned_long,_11,_52,_1023,_3U>::isInf(other);
    if (bVar2) {
      iVar3 = Float<unsigned_long,_11,_52,_1023,_3U>::sign(other,in_RSI,sig,in_RCX,in_R8,in_R9);
      other_local._4_4_ = Float<unsigned_int,_5,_5,_15,_2U>::inf(iVar3);
    }
    else {
      __tagb = other;
      bVar2 = Float<unsigned_long,_11,_52,_1023,_3U>::isNaN(other);
      if (bVar2) {
        Float<unsigned_int,_5,_5,_15,_2U>::nan((char *)__tagb);
        other_local._4_4_ = extraout_EAX;
      }
      else {
        bVar2 = Float<unsigned_long,_11,_52,_1023,_3U>::isZero(other);
        if (bVar2) {
          iVar3 = Float<unsigned_long,_11,_52,_1023,_3U>::sign
                            (other,in_RSI,sig_00,in_RCX,in_R8,in_R9);
          other_local._4_4_ = Float<unsigned_int,_5,_5,_15,_2U>::zero(iVar3);
        }
        else {
          iVar3 = Float<unsigned_long,_11,_52,_1023,_3U>::signBit(other);
          m._0_4_ = Float<unsigned_long,_11,_52,_1023,_3U>::exponent(other);
          for (_uStack_30 = Float<unsigned_long,_11,_52,_1023,_3U>::mantissa(other);
              (_uStack_30 & 0x10000000000000) == 0; _uStack_30 = _uStack_30 << 1) {
            m._0_4_ = (int)m + -1;
          }
          if ((int)m < -0xe) {
            if (-0xf - (int)m < 6) {
              bVar1 = -(char)(int)m + 0x21;
              Float<unsigned_int,_5,_5,_15,_2U>::Float
                        ((Float<unsigned_int,_5,_5,_15,_2U> *)((long)&other_local + 4),
                         iVar3 << 10 |
                         (uint)(_uStack_30 + (1L << (-(char)(int)m + 0x20U & 0x3f)) + -1 +
                                (_uStack_30 >> (bVar1 & 0x3f) & 1) >> (bVar1 & 0x3f)));
            }
            else {
              iVar3 = Float<unsigned_long,_11,_52,_1023,_3U>::sign
                                (other,in_RSI,sig_01,in_RCX,in_R8,in_R9);
              other_local._4_4_ = Float<unsigned_int,_5,_5,_15,_2U>::zero(iVar3);
            }
          }
          else {
            uVar4 = (_uStack_30 & 0xffefffffffffffff) + 0x3fffffffffff +
                    ((_uStack_30 & 0xffefffffffffffff) >> 0x2f & 1);
            uStack_30 = (uint)(uVar4 >> 0x2f);
            if ((uVar4 >> 0x2f & 0x20) != 0) {
              uStack_30 = 0;
              m._0_4_ = (int)m + 1;
            }
            if ((int)m < 0x10) {
              Float<unsigned_int,_5,_5,_15,_2U>::Float
                        ((Float<unsigned_int,_5,_5,_15,_2U> *)((long)&other_local + 4),
                         iVar3 << 10 | ((int)m + 0xf) * 0x20 | uStack_30);
            }
            else {
              iVar3 = Float<unsigned_long,_11,_52,_1023,_3U>::sign
                                (other,in_RSI,sig_01,(size_t *)0x2f,in_R8,in_R9);
              other_local._4_4_ = Float<unsigned_int,_5,_5,_15,_2U>::inf(iVar3);
            }
          }
        }
      }
    }
  }
  return (Float<unsigned_int,_5,_5,_15,_2U>)other_local._4_4_;
}

Assistant:

Float<StorageType, ExponentBits, MantissaBits, ExponentBias, Flags>
Float<StorageType, ExponentBits, MantissaBits, ExponentBias, Flags>::convert
	(const Float<OtherStorageType, OtherExponentBits, OtherMantissaBits, OtherExponentBias, OtherFlags>& other)
{
	if (!(Flags & FLOAT_HAS_SIGN) && other.sign() < 0)
	{
		// Negative number, truncate to zero.
		return zero(+1);
	}
	else if (other.isInf())
	{
		return inf(other.sign());
	}
	else if (other.isNaN())
	{
		return nan();
	}
	else if (other.isZero())
	{
		return zero(other.sign());
	}
	else
	{
		const int			eMin	= 1 - ExponentBias;
		const int			eMax	= ((1<<ExponentBits)-2) - ExponentBias;

		const StorageType	s		= StorageType((StorageType(other.signBit())) << (StorageType(ExponentBits+MantissaBits))); // \note Not sign, but sign bit.
		int					e		= other.exponent();
		deUint64			m		= other.mantissa();

		// Normalize denormalized values prior to conversion.
		while (!(m & (1ull<<OtherMantissaBits)))
		{
			m <<= 1;
			e  -= 1;
		}

		if (e < eMin)
		{
			// Underflow.
			if ((Flags & FLOAT_SUPPORT_DENORM) && (eMin-e-1 <= MantissaBits))
			{
				// Shift and round (RTE).
				int			bitDiff	= (OtherMantissaBits-MantissaBits) + (eMin-e);
				deUint64	half	= (1ull << (bitDiff - 1)) - 1;
				deUint64	bias	= (m >> bitDiff) & 1;

				return Float(StorageType(s | (m + half + bias) >> bitDiff));
			}
			else
				return zero(other.sign());
		}
		else
		{
			// Remove leading 1.
			m = m & ~(1ull<<OtherMantissaBits);

			if (MantissaBits < OtherMantissaBits)
			{
				// Round mantissa (round to nearest even).
				int			bitDiff	= OtherMantissaBits-MantissaBits;
				deUint64	half	= (1ull << (bitDiff - 1)) - 1;
				deUint64	bias	= (m >> bitDiff) & 1;

				m = (m + half + bias) >> bitDiff;

				if (m & (1ull<<MantissaBits))
				{
					// Overflow in mantissa.
					m  = 0;
					e += 1;
				}
			}
			else
			{
				int bitDiff = MantissaBits-OtherMantissaBits;
				m = m << bitDiff;
			}

			if (e > eMax)
			{
				// Overflow.
				return inf(other.sign());
			}
			else
			{
				DE_ASSERT(de::inRange(e, eMin, eMax));
				DE_ASSERT(((e + ExponentBias) & ~((1ull<<ExponentBits)-1)) == 0);
				DE_ASSERT((m & ~((1ull<<MantissaBits)-1)) == 0);

				return Float(StorageType(s | (StorageType(e + ExponentBias) << MantissaBits) | m));
			}
		}
	}
}